

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.h
# Opt level: O0

void __thiscall pbrt::syntactic::Token::Token(Token *this,Token *other)

{
  long in_RSI;
  Loc *in_RDI;
  Loc *in_stack_ffffffffffffffe0;
  
  Loc::Loc(in_stack_ffffffffffffffe0,in_RDI);
  *(undefined4 *)
   &in_RDI[1].file.super___shared_ptr<pbrt::syntactic::File,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(undefined4 *)(in_RSI + 0x18);
  std::__cxx11::string::string
            ((string *)
             &in_RDI[1].file.super___shared_ptr<pbrt::syntactic::File,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(string *)(in_RSI + 0x20));
  return;
}

Assistant:

Token(const Token &other) = default;